

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ParameterExpression::Deserialize(ParameterExpression *this,Deserializer *deserializer)

{
  tuple<duckdb::ParameterExpression_*,_std::default_delete<duckdb::ParameterExpression>_> this_00;
  pointer pPVar1;
  __uniq_ptr_impl<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::ParameterExpression_*,_std::default_delete<duckdb::ParameterExpression>_>
  .super__Head_base<0UL,_duckdb::ParameterExpression_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ParameterExpression_*,_std::default_delete<duckdb::ParameterExpression>_>
        )operator_new(0x58);
  ParameterExpression((ParameterExpression *)
                      this_00.
                      super__Tuple_impl<0UL,_duckdb::ParameterExpression_*,_std::default_delete<duckdb::ParameterExpression>_>
                      .super__Head_base<0UL,_duckdb::ParameterExpression_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::ParameterExpression_*,_std::default_delete<duckdb::ParameterExpression>_>
  .super__Head_base<0UL,_duckdb::ParameterExpression_*,_false>._M_head_impl =
       (tuple<duckdb::ParameterExpression_*,_std::default_delete<duckdb::ParameterExpression>_>)
       (tuple<duckdb::ParameterExpression_*,_std::default_delete<duckdb::ParameterExpression>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::ParameterExpression_*,_std::default_delete<duckdb::ParameterExpression>_>
       .super__Head_base<0UL,_duckdb::ParameterExpression_*,_false>._M_head_impl;
  pPVar1 = unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParameterExpression,_std::default_delete<duckdb::ParameterExpression>,_true>
                         *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,200,"identifier",&pPVar1->identifier);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::ParameterExpression_*,_std::default_delete<duckdb::ParameterExpression>_>
       .super__Head_base<0UL,_duckdb::ParameterExpression_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ParameterExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ParameterExpression>(new ParameterExpression());
	deserializer.ReadPropertyWithDefault<string>(200, "identifier", result->identifier);
	return std::move(result);
}